

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_16549e0::ConvolveScaleTestBase<unsigned_char>::Prep
          (ConvolveScaleTestBase<unsigned_char> *this,ACMRandom *rnd)

{
  uint32_t uVar1;
  ACMRandom *in_RDI;
  ACMRandom *in_stack_00000038;
  TestImage<unsigned_char> *in_stack_00000040;
  
  uVar1 = RandomSubpel(in_RDI);
  in_RDI[7].random_.state_ = uVar1;
  uVar1 = RandomSubpel(in_RDI);
  in_RDI[8].random_.state_ = uVar1;
  TestImage<unsigned_char>::Initialize(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

void Prep(ACMRandom *rnd) {
    assert(rnd);

    // Choose subpel_x_ and subpel_y_. They should be less than
    // SCALE_SUBPEL_SHIFTS; we also want to add extra weight to
    // "interesting" values: 0 and SCALE_SUBPEL_SHIFTS - 1
    subpel_x_ = RandomSubpel(rnd);
    subpel_y_ = RandomSubpel(rnd);

    image_->Initialize(rnd);
  }